

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderReturnCase::ShaderReturnCase
          (ShaderReturnCase *this,Context *context,char *name,char *description,bool isVertexCase,
          char *shaderSource,ShaderEvalFunc evalFunc,deUint32 requirements)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  char *shaderSource_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderReturnCase *this_local;
  
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext(context);
  ctxInfo = Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderReturnCase_00cac0b0;
  this->m_requirements = requirements;
  if (isVertexCase) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,shaderSource);
    std::__cxx11::string::operator=
              ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,
               "varying mediump vec4 v_color;\n\nvoid main (void)\n{\n    gl_FragColor = v_color;\n}\n"
              );
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,shaderSource);
    std::__cxx11::string::operator=
              ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,
               "attribute highp   vec4 a_position;\nattribute highp   vec4 a_coords;\nvarying   mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_coords = a_coords;\n}\n"
              );
  }
  return;
}

Assistant:

ShaderReturnCase::ShaderReturnCase (Context& context, const char* name, const char* description, bool isVertexCase, const char* shaderSource, ShaderEvalFunc evalFunc, deUint32 requirements)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_requirements	(requirements)
{
	if (isVertexCase)
	{
		m_vertShaderSource = shaderSource;
		m_fragShaderSource =
			"varying mediump vec4 v_color;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_FragColor = v_color;\n"
			"}\n";
	}
	else
	{
		m_fragShaderSource = shaderSource;
		m_vertShaderSource =
			"attribute highp   vec4 a_position;\n"
			"attribute highp   vec4 a_coords;\n"
			"varying   mediump vec4 v_coords;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_Position = a_position;\n"
			"    v_coords = a_coords;\n"
			"}\n";
	}
}